

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

bool google::protobuf::compiler::js::anon_unknown_0::IsPrimitive(string *type)

{
  bool bVar1;
  bool local_11;
  string *type_local;
  
  bVar1 = std::operator==(type,"undefined");
  local_11 = true;
  if (!bVar1) {
    bVar1 = std::operator==(type,"string");
    local_11 = true;
    if (!bVar1) {
      bVar1 = std::operator==(type,"number");
      local_11 = true;
      if (!bVar1) {
        local_11 = std::operator==(type,"boolean");
      }
    }
  }
  return local_11;
}

Assistant:

bool IsPrimitive(const std::string& type) {
  return type == "undefined" || type == "string" || type == "number" ||
         type == "boolean";
}